

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChunkV.cpp
# Opt level: O2

BufferPos * __thiscall
adios2::format::ChunkV::Allocate
          (BufferPos *__return_storage_ptr__,ChunkV *this,size_t size,size_t align)

{
  Chunk *v;
  size_t *psVar1;
  pointer pVVar2;
  pointer pCVar3;
  size_t sVar4;
  pointer pVVar5;
  char *pcVar6;
  long lVar7;
  ulong size_00;
  size_t sVar8;
  Chunk c;
  VecEntry entry;
  Chunk local_68;
  value_type local_50;
  
  if (size == 0) {
    sVar8 = (this->super_BufferV).CurOffset;
    __return_storage_ptr__->bufferIdx = -1;
    __return_storage_ptr__->posInBuffer = 0;
    __return_storage_ptr__->globalPos = sVar8;
    return __return_storage_ptr__;
  }
  BufferV::AlignBuffer(&this->super_BufferV,align);
  pVVar5 = (this->super_BufferV).DataV.
           super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->super_BufferV).DataV.
           super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pVVar2 != pVVar5) && (pVVar2[-1].External == false)) {
    sVar8 = this->m_TailChunkPos;
    if (this->m_TailChunk->Ptr + (sVar8 - pVVar2[-1].Size) == (char *)pVVar2[-1].Base) {
      if (sVar8 + size <= this->m_ChunkSize) {
        pVVar2[-1].Size = pVVar2[-1].Size + size;
        this->m_TailChunkPos = sVar8 + size;
        goto LAB_004e94ad;
      }
      pCVar3 = (this->m_Chunks).
               super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      v = pCVar3 + -1;
      sVar4 = ChunkAlloc(this,v,sVar8);
      sVar8 = this->m_TailChunkPos;
      pcVar6 = pCVar3[-1].Ptr;
      lVar7 = sVar4 - sVar8;
      if (lVar7 != 0) {
        for (; sVar4 != sVar8; sVar8 = sVar8 + 1) {
          pcVar6[sVar8] = '\0';
        }
        psVar1 = &(this->super_BufferV).CurOffset;
        *psVar1 = *psVar1 + lVar7;
        pcVar6 = v->Ptr;
      }
      pVVar2 = (this->super_BufferV).DataV.
               super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pVVar2[-1].Size = sVar4;
      pVVar2[-1].Base = pcVar6;
      this->m_TailChunkPos = 0;
      this->m_TailChunk = (Chunk *)0x0;
    }
  }
  size_00 = this->m_ChunkSize;
  if (this->m_ChunkSize <= size) {
    size_00 = size;
  }
  local_68.Ptr = (char *)0x0;
  local_68.AllocatedPtr = (void *)0x0;
  local_68.Size = 0;
  ChunkAlloc(this,&local_68,size_00);
  std::vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>::
  push_back(&this->m_Chunks,&local_68);
  pCVar3 = (this->m_Chunks).
           super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->m_TailChunk = pCVar3 + -1;
  this->m_TailChunkPos = size;
  local_50.External = false;
  local_50.Base = pCVar3[-1].Ptr;
  local_50.Offset = 0;
  local_50.Size = size;
  std::vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  ::push_back(&(this->super_BufferV).DataV,&local_50);
  pVVar5 = (this->super_BufferV).DataV.
           super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar8 = 0;
LAB_004e94ad:
  sVar4 = (this->super_BufferV).CurOffset;
  __return_storage_ptr__->bufferIdx =
       (int)((ulong)((long)(this->super_BufferV).DataV.
                           super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5) >> 5) + -1;
  __return_storage_ptr__->posInBuffer = sVar8;
  __return_storage_ptr__->globalPos = sVar4;
  (this->super_BufferV).CurOffset = size + sVar4;
  return __return_storage_ptr__;
}

Assistant:

BufferV::BufferPos ChunkV::Allocate(const size_t size, size_t align)
{
    /*std::cout << "  Allocate: size = " << size << " align = " << align
              << std::endl;*/
    if (size == 0)
    {
        return BufferPos(-1, 0, CurOffset);
    }

    AlignBuffer(align);

    // we can possibly append this entry to the last if the last was
    // internal
    bool AppendPossible =
        DataV.size() && !DataV.back().External &&
        (m_TailChunk->Ptr + m_TailChunkPos - DataV.back().Size == DataV.back().Base);

    if (AppendPossible && (m_TailChunkPos + size > m_ChunkSize))
    {
        // No room in current chunk, close it out
        // realloc down to used size (helpful?) and set size in array
        Chunk &c = m_Chunks.back();
        size_t actualsize = ChunkAlloc(c, m_TailChunkPos);
        size_t alignment = actualsize - m_TailChunkPos;
        if (alignment)
        {
            auto p = c.Ptr + m_TailChunkPos;
            std::fill(p, p + alignment, 0);
            CurOffset += alignment;
        }
        // Update entry in DataV as size and potentiall ptr has changed
        // Learned from sanitizer: downsizing realloc still may change pointer
        VecEntry &dv = DataV.back();
        dv.Size = actualsize;
        dv.Base = c.Ptr;
        m_TailChunkPos = 0;
        m_TailChunk = nullptr;
        AppendPossible = false;
    }

    size_t bufferPos = 0;
    if (AppendPossible)
    {
        // We can use current chunk, just append the data;
        bufferPos = m_TailChunkPos;
        DataV.back().Size += size;
        m_TailChunkPos += size;
    }
    else
    {
        // We need a new chunk, get the larger of size or m_ChunkSize
        size_t NewSize = m_ChunkSize;
        if (size > m_ChunkSize)
            NewSize = size;
        Chunk c{nullptr, nullptr, 0};
        ChunkAlloc(c, NewSize);
        m_Chunks.push_back(c);
        m_TailChunk = &m_Chunks.back();
        bufferPos = 0;
        m_TailChunkPos = size;
        VecEntry entry = {false, m_TailChunk->Ptr, 0, size};
        DataV.push_back(entry);
    }

    BufferPos bp(static_cast<int>(DataV.size() - 1), bufferPos, CurOffset);
    // valid ptr anytime <-- DataV[idx] + bufferPos;

    CurOffset += size;

    return bp;
}